

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O0

int dwarf_get_ADDR_name(uint val,char **s_out)

{
  char **s_out_local;
  uint val_local;
  
  switch(val) {
  case 0:
    *s_out = "DW_ADDR_none";
    s_out_local._4_4_ = 0;
    break;
  default:
    s_out_local._4_4_ = -1;
    break;
  case 8:
    *s_out = "DW_ADDR_TI_PTR8";
    s_out_local._4_4_ = 0;
    break;
  case 0x10:
    *s_out = "DW_ADDR_TI_PTR16";
    s_out_local._4_4_ = 0;
    break;
  case 0x16:
    *s_out = "DW_ADDR_TI_PTR22";
    s_out_local._4_4_ = 0;
    break;
  case 0x17:
    *s_out = "DW_ADDR_TI_PTR23";
    s_out_local._4_4_ = 0;
    break;
  case 0x18:
    *s_out = "DW_ADDR_TI_PTR24";
    s_out_local._4_4_ = 0;
    break;
  case 0x20:
    *s_out = "DW_ADDR_TI_PTR32";
    s_out_local._4_4_ = 0;
  }
  return s_out_local._4_4_;
}

Assistant:

int
dwarf_get_ADDR_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_ADDR_none:
        *s_out = "DW_ADDR_none";
        return DW_DLV_OK;
    case DW_ADDR_TI_PTR8:
        *s_out = "DW_ADDR_TI_PTR8";
        return DW_DLV_OK;
    case DW_ADDR_TI_PTR16:
        *s_out = "DW_ADDR_TI_PTR16";
        return DW_DLV_OK;
    case DW_ADDR_TI_PTR22:
        *s_out = "DW_ADDR_TI_PTR22";
        return DW_DLV_OK;
    case DW_ADDR_TI_PTR23:
        *s_out = "DW_ADDR_TI_PTR23";
        return DW_DLV_OK;
    case DW_ADDR_TI_PTR24:
        *s_out = "DW_ADDR_TI_PTR24";
        return DW_DLV_OK;
    case DW_ADDR_TI_PTR32:
        *s_out = "DW_ADDR_TI_PTR32";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}